

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_2_5::(anonymous_namespace)::jacobiRotateRight<double,0,2>
               (Matrix33<double> *A,double c,double s)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  Matrix33<double> *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double tau2;
  double tau1;
  int i;
  int local_1c;
  
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    pdVar3 = Matrix33<double>::operator[](in_RDI,local_1c);
    dVar1 = *pdVar3;
    pdVar3 = Matrix33<double>::operator[](in_RDI,local_1c);
    dVar2 = pdVar3[2];
    pdVar3 = Matrix33<double>::operator[](in_RDI,local_1c);
    *pdVar3 = in_XMM0_Qa * dVar1 + -(in_XMM1_Qa * dVar2);
    pdVar3 = Matrix33<double>::operator[](in_RDI,local_1c);
    pdVar3[2] = in_XMM1_Qa * dVar1 + in_XMM0_Qa * dVar2;
  }
  return;
}

Assistant:

void
jacobiRotateRight (IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A,
                   const T c,
                   const T s)
{
    for (int i = 0; i < 3; ++i)
    {
        const T tau1 = A[i][j];
        const T tau2 = A[i][k];
        A[i][j] = c * tau1 - s * tau2;
        A[i][k] = s * tau1 + c * tau2;
    }
}